

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O0

GLuint ShaderDb::load_shader_file(string *p_filepath,ShaderType p_type)

{
  GLuint p_id;
  undefined1 local_48 [4];
  GLuint shader_id;
  string *local_28;
  string *shader_data;
  string *psStack_18;
  ShaderType p_type_local;
  string *p_filepath_local;
  
  shader_data._4_4_ = p_type;
  psStack_18 = p_filepath;
  read_shader_code_file((string *)local_48,p_filepath,p_type);
  local_28 = (string *)local_48;
  p_id = compile_shader(local_28,shader_data._4_4_);
  if (p_id == 0) {
    p_filepath_local._4_4_ = 0;
  }
  else {
    p_filepath_local._4_4_ =
         add_shader_file(p_id,psStack_18,local_28,(ShaderType *)((long)&shader_data + 4));
  }
  std::__cxx11::string::~string((string *)local_48);
  return p_filepath_local._4_4_;
}

Assistant:

GLuint ShaderDb::load_shader_file(
    const std::string &p_filepath,
    const ShaderType p_type) noexcept
{
    const auto &shader_data = read_shader_code_file(p_filepath, p_type);
    GLuint shader_id = compile_shader(shader_data, p_type);
    if (shader_id != DEFAULT_SHADER_ID)
    {
        return add_shader_file(
            shader_id,
            p_filepath,
            shader_data,
            p_type);
    }
    return shader_id;
}